

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_overload_function(sqlite3 *db,char *zName,int nArg)

{
  int iVar1;
  FuncDef *pFVar2;
  char *p;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  iVar1 = 0;
  pFVar2 = sqlite3FindFunction(db,zName,nArg,'\x01','\0');
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (pFVar2 == (FuncDef *)0x0) {
    p = sqlite3_mprintf(zName);
    if (p == (char *)0x0) {
      iVar1 = 7;
    }
    else {
      iVar1 = sqlite3_create_function_v2
                        (db,zName,nArg,1,p,sqlite3InvalidFunction,
                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                         (_func_void_sqlite3_context_ptr *)0x0,sqlite3_free);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_overload_function(
  sqlite3 *db,
  const char *zName,
  int nArg
){
  int rc;
  char *zCopy;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zName==0 || nArg<-2 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3FindFunction(db, zName, nArg, SQLITE_UTF8, 0)!=0;
  sqlite3_mutex_leave(db->mutex);
  if( rc ) return SQLITE_OK;
  zCopy = sqlite3_mprintf(zName);
  if( zCopy==0 ) return SQLITE_NOMEM;
  return sqlite3_create_function_v2(db, zName, nArg, SQLITE_UTF8,
                           zCopy, sqlite3InvalidFunction, 0, 0, sqlite3_free);
}